

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  ushort uVar1;
  int iVar2;
  Wlc_Obj_t *p_00;
  int *piVar3;
  uint uVar4;
  int i;
  ulong uVar5;
  ulong uVar6;
  
  p_00 = Wlc_NtkObj(p,iObj);
  vFanins->nSize = 0;
  for (i = 0; i < (int)p_00->nFanins; i = i + 1) {
    iVar2 = Wlc_ObjFaninId(p_00,i);
    iVar2 = Vec_IntEntry(&p->vCopies,iVar2);
    Vec_IntPush(vFanins,iVar2);
  }
  uVar1 = *(ushort *)p_00 & 0x3f;
  if ((uVar1 != 0x2c) && (uVar1 != 0x13)) {
    if (uVar1 == 6) {
      piVar3 = Wlc_ObjFanins(p_00);
      uVar4 = (p_00->End - p_00->Beg) + 1;
      uVar4 = (((int)uVar4 >> 5) + 1) - (uint)((uVar4 & 0x1f) == 0);
      uVar5 = 0;
      uVar6 = (ulong)uVar4;
      if ((int)uVar4 < 1) {
        uVar6 = uVar5;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        Vec_IntPush(vFanins,piVar3[uVar5]);
      }
    }
    return;
  }
  if (vFanins->nSize == 1) {
    Vec_IntPush(vFanins,(p_00->field_8).Fanins[1]);
    return;
  }
  __assert_fail("Vec_IntSize(vFanins) == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/wlc/wlcNtk.c"
                ,0x20d,"void Wlc_ObjCollectCopyFanins(Wlc_Ntk_t *, int, Vec_Int_t *)");
}

Assistant:

void Wlc_ObjCollectCopyFanins( Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    int i, iFanin;
    Wlc_Obj_t * pObj = Wlc_NtkObj( p, iObj );
    Vec_IntClear( vFanins );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Vec_IntPush( vFanins, Wlc_ObjCopy(p, iFanin) );
    // special treatment of CONST and SELECT
    if ( pObj->Type == WLC_OBJ_CONST )
    {
        int * pInts = Wlc_ObjConstValue( pObj );
        int nInts = Abc_BitWordNum( Wlc_ObjRange(pObj) );
        for ( i = 0; i < nInts; i++ )
            Vec_IntPush( vFanins, pInts[i] );
    }
    else if ( pObj->Type == WLC_OBJ_BIT_SELECT || pObj->Type == WLC_OBJ_TABLE )
    {
        assert( Vec_IntSize(vFanins) == 1 );
        Vec_IntPush( vFanins, pObj->Fanins[1] );
    }
}